

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  uint uVar1;
  uint uVar2;
  Section *pSVar3;
  long lVar4;
  Section *pSVar5;
  CodeHolder *self;
  Error EVar6;
  Section **ppSVar7;
  long lVar8;
  uint uVar9;
  uint64_t in_RSI;
  CodeHolder *in_RDI;
  bool bVar10;
  size_t addressTableSize;
  uint32_t byte1;
  uint32_t byte0;
  uint64_t addrDst;
  uint64_t addrSrc;
  size_t atEntryIndex;
  AddressTableEntry *atEntry;
  size_t valueOffset;
  Error _err_1;
  Expression *expression;
  uint8_t *buffer;
  size_t regionSize;
  uint64_t sourceOffset;
  uint64_t sectionOffset;
  uint64_t value;
  Section *targetSection;
  Section *sourceSection;
  RelocEntry *re;
  iterator __end2;
  iterator __begin2;
  ZoneVector<asmjit::v1_14::RelocEntry_*> *__range2;
  Error _err;
  uint8_t *addressTableEntryData;
  uint32_t addressTableEntryCount;
  Section *addressTableSection;
  uint32_t addressSize;
  undefined5 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd5;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  ZoneVector<asmjit::v1_14::Section_*> *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  int64_t in_stack_fffffffffffffcf0;
  uint32_t in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_2e1;
  unsigned_long local_2e0;
  AddressTableEntry *local_2d8;
  ulong local_2d0;
  undefined4 local_2c4;
  CodeHolder *local_2c0;
  uint8_t *local_2b8;
  ulong local_2b0;
  uint64_t *out;
  Expression *exp;
  Section *local_290;
  long *local_270;
  uint8_t *local_258;
  int local_24c;
  Error local_224;
  undefined8 local_f8;
  undefined8 local_f0;
  long local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  long local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  AddressTableEntry *local_90;
  AddressTableEntry *local_88;
  undefined8 local_80;
  uint8_t *local_78;
  Arch local_6a;
  Arch local_69;
  undefined8 *local_68;
  undefined8 *local_60;
  long *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  long *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  long *local_28;
  ZoneVector<asmjit::v1_14::RelocEntry_*> *local_20;
  ZoneVector<asmjit::v1_14::RelocEntry_*> *local_18;
  undefined8 local_10;
  uint8_t *local_8;
  
  if (in_RSI == 0xffffffffffffffff) {
    local_224 = DebugUtils::errored(2);
  }
  else {
    in_RDI->_baseAddress = in_RSI;
    local_6a = (in_RDI->_environment)._arch;
    uVar9 = 8;
    if ((local_6a & k32BitMask) == k32BitMask) {
      uVar9 = 4;
    }
    pSVar3 = in_RDI->_addressTableSection;
    local_24c = 0;
    local_258 = (uint8_t *)0x0;
    local_69 = local_6a;
    if (pSVar3 != (Section *)0x0) {
      EVar6 = reserveBuffer(in_RDI,(CodeBuffer *)
                                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                            (size_t)in_stack_fffffffffffffcd8);
      if (EVar6 != 0) {
        return EVar6;
      }
      local_258 = (pSVar3->_buffer)._data;
    }
    local_20 = &in_RDI->_relocations;
    lVar4 = *(long *)local_20;
    uVar1 = *(uint *)&in_RDI->field_0x110;
    local_18 = local_20;
    for (local_270 = *(long **)local_20; local_270 != (long *)(lVar4 + (ulong)uVar1 * 8);
        local_270 = local_270 + 1) {
      lVar8 = *local_270;
      if (*(int *)(lVar8 + 4) != 0) {
        ppSVar7 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                            (in_stack_fffffffffffffcd8,
                             CONCAT17(in_stack_fffffffffffffcd7,
                                      CONCAT16(in_stack_fffffffffffffcd6,
                                               CONCAT15(in_stack_fffffffffffffcd5,
                                                        in_stack_fffffffffffffcd0))));
        pSVar5 = *ppSVar7;
        local_290 = (Section *)0x0;
        if (*(int *)(lVar8 + 0x14) != -1) {
          ppSVar7 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                              (in_stack_fffffffffffffcd8,
                               CONCAT17(in_stack_fffffffffffffcd7,
                                        CONCAT16(in_stack_fffffffffffffcd6,
                                                 CONCAT15(in_stack_fffffffffffffcd5,
                                                          in_stack_fffffffffffffcd0))));
          local_290 = *ppSVar7;
        }
        self = *(CodeHolder **)(lVar8 + 0x20);
        exp = (Expression *)pSVar5->_offset;
        out = *(uint64_t **)(lVar8 + 0x18);
        local_2b0 = (ulong)*(byte *)(lVar8 + 10);
        bVar10 = true;
        if (*(ulong *)(lVar8 + 0x18) < (pSVar5->_buffer)._size) {
          bVar10 = (pSVar5->_buffer)._size - *(long *)(lVar8 + 0x18) < local_2b0;
        }
        if (bVar10) {
          EVar6 = DebugUtils::errored(0x17);
          return EVar6;
        }
        local_2b8 = (pSVar5->_buffer)._data;
        in_stack_fffffffffffffcd8 =
             (ZoneVector<asmjit::v1_14::Section_*> *)(ulong)(*(int *)(lVar8 + 4) - 1);
        switch(in_stack_fffffffffffffcd8) {
        case (ZoneVector<asmjit::v1_14::Section_*> *)0x0:
          local_2c0 = self;
          EVar6 = CodeHolder_evaluateExpression(self,exp,out);
          if (EVar6 != 0) {
            return EVar6;
          }
          local_2c4 = 0;
          break;
        case (ZoneVector<asmjit::v1_14::Section_*> *)0x1:
          break;
        case (ZoneVector<asmjit::v1_14::Section_*> *)0x2:
          if (local_290 == (Section *)0x0) {
            EVar6 = DebugUtils::errored(0x17);
            return EVar6;
          }
          break;
        case (ZoneVector<asmjit::v1_14::Section_*> *)0x3:
          lVar8 = (long)self - (long)((long)out + (long)(exp->valueType + local_2b0 + (in_RSI - 1)))
          ;
          if (4 < uVar9) {
            local_b0 = 0xffffffff80000000;
            local_b8 = 0x7fffffff;
            local_58 = &local_a8;
            local_60 = &local_b0;
            local_68 = &local_b8;
            in_stack_fffffffffffffcd7 = -0x80000001 < lVar8 && lVar8 < 0x80000000;
            local_a8 = lVar8;
            local_a0 = lVar8;
            if (-0x80000001 >= lVar8 || lVar8 >= 0x80000000) {
              EVar6 = DebugUtils::errored(0x18);
              return EVar6;
            }
          }
          break;
        case (ZoneVector<asmjit::v1_14::Section_*> *)0x4:
          local_98 = lVar8 + 8;
          local_2d0 = *(long *)(lVar8 + 0x18) + (ulong)*(byte *)(lVar8 + 0xc);
          if ((*(char *)(lVar8 + 0xb) != '\x04') || (local_2d0 < 2)) {
            EVar6 = DebugUtils::errored(0x17);
            return EVar6;
          }
          local_c8 = (long)self -
                     (long)((long)out + (long)(exp->valueType + local_2b0 + (in_RSI - 1)));
          local_d0 = 0xffffffff80000000;
          local_d8 = 0x7fffffff;
          local_40 = &local_c8;
          local_48 = &local_d0;
          local_50 = &local_d8;
          in_stack_fffffffffffffcd6 = -0x80000001 < local_c8 && local_c8 < 0x80000000;
          local_c0 = local_c8;
          if (-0x80000001 >= local_c8 || local_c8 >= 0x80000000) {
            local_2e0 = *(unsigned_long *)(lVar8 + 0x20);
            local_2d8 = ZoneTree<asmjit::v1_14::AddressTableEntry>::
                        get<unsigned_long,asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                                  (&in_RDI->_addressTableEntries,&local_2e0,&local_2e1);
            if (local_2d8 == (AddressTableEntry *)0x0) {
              EVar6 = DebugUtils::errored(0x17);
              return EVar6;
            }
            if (pSVar3 == (Section *)0x0) {
              DebugUtils::assertionFailed((char *)__range2,__begin2._4_4_,(char *)__end2);
            }
            if (*(int *)(local_2d8 + 0x18) == -1) {
              *(int *)(local_2d8 + 0x18) = local_24c;
              local_24c = local_24c + 1;
            }
            uVar2 = *(uint *)(local_2d8 + 0x18);
            local_e8 = (pSVar3->_offset + (ulong)uVar2 * (ulong)uVar9) -
                       (long)((long)out + (long)(exp->valueType + (local_2b0 - 1)));
            local_f0 = 0xffffffff80000000;
            local_f8 = 0x7fffffff;
            local_28 = &local_e8;
            local_30 = &local_f0;
            local_38 = &local_f8;
            in_stack_fffffffffffffcd5 = -0x80000001 < local_e8 && local_e8 < 0x80000000;
            local_e0 = local_e8;
            local_90 = local_2d8;
            local_88 = local_2d8;
            if (-0x80000001 >= local_e8 || local_e8 >= 0x80000000) {
              EVar6 = DebugUtils::errored(0x18);
              return EVar6;
            }
            in_stack_fffffffffffffcfc = 0xff;
            if (local_2b8[local_2d0 - 1] == 0xe8) {
              in_stack_fffffffffffffcf8 = x86EncodeMod(0,2,5);
            }
            else {
              if (local_2b8[local_2d0 - 1] != 0xe9) {
                EVar6 = DebugUtils::errored(0x17);
                return EVar6;
              }
              in_stack_fffffffffffffcf8 = x86EncodeMod(0,4,5);
            }
            local_2b8[local_2d0 - 2] = (uint8_t)in_stack_fffffffffffffcfc;
            local_2b8[local_2d0 - 1] = (uint8_t)in_stack_fffffffffffffcf8;
            local_78 = local_258 + (ulong)uVar2 * (ulong)uVar9;
            local_80 = *(undefined8 *)(lVar8 + 0x20);
            *(undefined8 *)local_78 = local_80;
            local_10 = local_80;
            local_8 = local_78;
          }
          break;
        default:
          EVar6 = DebugUtils::errored(0x17);
          return EVar6;
        }
        bVar10 = CodeWriterUtils::writeOffset
                           ((void *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                            in_stack_fffffffffffffcf0,(OffsetFormat *)in_RDI);
        if (!bVar10) {
          EVar6 = DebugUtils::errored(0x17);
          return EVar6;
        }
      }
    }
    ppSVar7 = ZoneVector<asmjit::v1_14::Section_*>::last
                        ((ZoneVector<asmjit::v1_14::Section_*> *)0x11df7e);
    if (*ppSVar7 == pSVar3) {
      if (pSVar3 == (Section *)0x0) {
        DebugUtils::assertionFailed((char *)__range2,__begin2._4_4_,(char *)__end2);
      }
      (pSVar3->_buffer)._size = (ulong)(local_24c * uVar9);
      pSVar3->_virtualSize = (ulong)(local_24c * uVar9);
    }
    local_224 = 0;
  }
  return local_224;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocType::kNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();

    switch (re->relocType()) {
      case RelocType::kExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocType::kAbsToAbs: {
        break;
      }

      case RelocType::kRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocType::kAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;

        // Sign extend as we are not interested in the high 32-bit word in a 32-bit address space.
        if (addressSize <= 4)
          value = uint64_t(int64_t(int32_t(value & 0xFFFFFFFFu)));
        else if (!Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

        break;
      }

      case RelocType::kX64AddressEntry: {
        size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    if (!CodeWriterUtils::writeOffset(buffer + re->sourceOffset(), int64_t(value), re->format())) {
      return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    ASMJIT_ASSERT(addressTableSection != nullptr);

    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}